

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer_queue.hpp
# Opt level: O2

bool __thiscall
asio::detail::
timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
::enqueue_timer(timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
                *this,time_type *time,per_timer_data *timer,wait_op *op)

{
  per_timer_data *ppVar1;
  wait_op *pwVar2;
  heap_entry entry;
  value_type local_28;
  
  if ((timer->prev_ == (per_timer_data *)0x0) && (this->timers_ != timer)) {
    timer->heap_index_ =
         (long)(this->heap_).
               super__Vector_base<asio::detail::timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>::heap_entry,_std::allocator<asio::detail::timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>::heap_entry>_>
               ._M_impl.super__Vector_impl_data._M_finish -
         (long)(this->heap_).
               super__Vector_base<asio::detail::timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>::heap_entry,_std::allocator<asio::detail::timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>::heap_entry>_>
               ._M_impl.super__Vector_impl_data._M_start >> 4;
    local_28.time_ = (time_type)(time->__d).__r;
    local_28.timer_ = timer;
    std::
    vector<asio::detail::timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>::heap_entry,_std::allocator<asio::detail::timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>::heap_entry>_>
    ::push_back(&this->heap_,&local_28);
    up_heap(this,((long)(this->heap_).
                        super__Vector_base<asio::detail::timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>::heap_entry,_std::allocator<asio::detail::timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>::heap_entry>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->heap_).
                        super__Vector_base<asio::detail::timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>::heap_entry,_std::allocator<asio::detail::timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>::heap_entry>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 4) - 1);
    ppVar1 = this->timers_;
    timer->next_ = ppVar1;
    timer->prev_ = (per_timer_data *)0x0;
    if (ppVar1 != (per_timer_data *)0x0) {
      ppVar1->prev_ = timer;
    }
    this->timers_ = timer;
  }
  (op->super_operation).next_ = (scheduler_operation *)0x0;
  pwVar2 = (timer->op_queue_).back_;
  if (pwVar2 == (wait_op *)0x0) {
    pwVar2 = (wait_op *)timer;
  }
  (pwVar2->super_operation).next_ = &op->super_operation;
  (timer->op_queue_).back_ = op;
  return op == (timer->op_queue_).front_ && timer->heap_index_ == 0;
}

Assistant:

bool enqueue_timer(const time_type& time, per_timer_data& timer, wait_op* op)
  {
    // Enqueue the timer object.
    if (timer.prev_ == 0 && &timer != timers_)
    {
      if (this->is_positive_infinity(time))
      {
        // No heap entry is required for timers that never expire.
        timer.heap_index_ = (std::numeric_limits<std::size_t>::max)();
      }
      else
      {
        // Put the new timer at the correct position in the heap. This is done
        // first since push_back() can throw due to allocation failure.
        timer.heap_index_ = heap_.size();
        heap_entry entry = { time, &timer };
        heap_.push_back(entry);
        up_heap(heap_.size() - 1);
      }

      // Insert the new timer into the linked list of active timers.
      timer.next_ = timers_;
      timer.prev_ = 0;
      if (timers_)
        timers_->prev_ = &timer;
      timers_ = &timer;
    }

    // Enqueue the individual timer operation.
    timer.op_queue_.push(op);

    // Interrupt reactor only if newly added timer is first to expire.
    return timer.heap_index_ == 0 && timer.op_queue_.front() == op;
  }